

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O0

SizeData * __thiscall
Rml::ElementHandleTargetData::GetSizeData
          (SizeData *__return_storage_ptr__,ElementHandleTargetData *this,Vector2f *drag_delta_min,
          Vector2f *drag_delta_max)

{
  value_type_conflict2 vVar1;
  Box *this_00;
  BoxSizing BVar2;
  LengthPercentageAuto LVar3;
  MinWidth length;
  MaxWidth length_00;
  const_reference pvVar4;
  float fVar5;
  float fVar6;
  Vector2f VVar7;
  bool local_149;
  SizeData *data;
  bool local_119;
  Vector2<float> local_110;
  Vector2<float> local_108;
  Vector2f local_100;
  Vector2<float> local_f0;
  Vector2<float> local_e8;
  Vector2f local_e0;
  Vector2f local_d8;
  Vector2<float> local_d0;
  Vector2<float> local_c8;
  Vector2f local_c0;
  Vector2f local_b8;
  Vector2f local_b0;
  Vector2f local_a8;
  Vector2f distance_to_bottom_right;
  Vector2<float> local_90;
  Vector2f max_size;
  Vector2<float> local_78;
  Vector2f min_size;
  Type local_68;
  Type local_60;
  Type local_58;
  Type local_50;
  Type local_48;
  Type local_40;
  Type local_38;
  Vector2f local_30;
  Vector2f local_28;
  Vector2f *local_20;
  Vector2f *drag_delta_max_local;
  Vector2f *drag_delta_min_local;
  ElementHandleTargetData *this_local;
  
  local_20 = drag_delta_max;
  drag_delta_max_local = drag_delta_min;
  drag_delta_min_local = (Vector2f *)this;
  Vector2<float>::Vector2(&__return_storage_ptr__->original_size);
  Vector2<float>::Vector2(&__return_storage_ptr__->original_position_bottom_right);
  Vector2<bool>::Vector2(&__return_storage_ptr__->width_height);
  Vector2<bool>::Vector2(&__return_storage_ptr__->bottom_right);
  this_00 = this->box;
  BVar2 = Style::ComputedValues::box_sizing(this->computed);
  local_28 = Box::GetSize(this_00,(BVar2 != BorderBox) + 1 + (uint)(BVar2 != BorderBox));
  __return_storage_ptr__->original_size = local_28;
  fVar5 = GetPositionRight(this);
  fVar6 = GetPositionBottom(this);
  Vector2<float>::Vector2(&local_30,fVar5,fVar6);
  __return_storage_ptr__->original_position_bottom_right = local_30;
  LVar3 = Style::ComputedValues::right(this->computed);
  local_38 = LVar3.type;
  (__return_storage_ptr__->bottom_right).x = local_38 != Auto;
  LVar3 = Style::ComputedValues::bottom(this->computed);
  local_40 = LVar3.type;
  (__return_storage_ptr__->bottom_right).y = local_40 != Auto;
  LVar3 = Style::ComputedValues::left(this->computed);
  local_48 = LVar3.type;
  local_119 = true;
  if (local_48 != Auto) {
    LVar3 = Style::ComputedValues::right(this->computed);
    local_50 = LVar3.type;
    local_119 = true;
    if (local_50 != Auto) {
      LVar3 = Style::ComputedValues::width(this->computed);
      local_58 = LVar3.type;
      local_119 = local_58 != Auto;
    }
  }
  (__return_storage_ptr__->width_height).x = local_119;
  LVar3 = Style::ComputedValues::top(this->computed);
  local_60 = LVar3.type;
  local_149 = true;
  if (local_60 != Auto) {
    LVar3 = Style::ComputedValues::bottom(this->computed);
    local_68 = LVar3.type;
    local_149 = true;
    if (local_68 != Auto) {
      min_size = (Vector2f)Style::ComputedValues::height(this->computed);
      local_149 = min_size.x._0_1_ != Auto;
    }
  }
  (__return_storage_ptr__->width_height).y = local_149;
  length = Style::ComputedValues::min_width(this->computed);
  fVar5 = ResolveValue(length,(this->containing_block).x);
  max_size = (Vector2f)Style::ComputedValues::min_height(this->computed);
  fVar6 = ResolveValue((LengthPercentage)max_size,(this->containing_block).y);
  Vector2<float>::Vector2(&local_78,fVar5,fVar6);
  length_00 = Style::ComputedValues::max_width(this->computed);
  fVar5 = ResolveValueOr(length_00,(this->containing_block).x,3.4028235e+38);
  distance_to_bottom_right = (Vector2f)Style::ComputedValues::max_height(this->computed);
  fVar6 = ResolveValueOr((LengthPercentage)distance_to_bottom_right,(this->containing_block).y,
                         3.4028235e+38);
  Vector2<float>::Vector2(&local_90,fVar5,fVar6);
  local_b0 = DistanceToTopLeft(this);
  local_a8 = DistanceToBottomRight(this,local_b0);
  local_c0 = *drag_delta_max_local;
  local_d0.x = (__return_storage_ptr__->original_size).x;
  local_d0.y = (__return_storage_ptr__->original_size).y;
  local_c8 = Vector2<float>::operator-(&local_78,local_d0);
  local_b8 = Math::Max<Rml::Vector2<float>>(local_c0,local_c8);
  *drag_delta_max_local = local_b8;
  local_e0 = *local_20;
  local_f0.x = (__return_storage_ptr__->original_size).x;
  local_f0.y = (__return_storage_ptr__->original_size).y;
  local_e8 = Vector2<float>::operator-(&local_90,local_f0);
  local_d8 = Math::Min<Rml::Vector2<float>>(local_e0,local_e8);
  *local_20 = local_d8;
  local_100 = *local_20;
  pvVar4 = ::std::array<float,_4UL>::operator[](&this->resolved_edge_margin,1);
  vVar1 = *pvVar4;
  pvVar4 = ::std::array<float,_4UL>::operator[](&this->resolved_edge_margin,2);
  Vector2<float>::Vector2(&local_110,-vVar1,-*pvVar4);
  local_108 = Vector2<float>::operator+(&local_110,local_a8);
  VVar7 = Math::Min<Rml::Vector2<float>>(local_100,local_108);
  *local_20 = VVar7;
  return __return_storage_ptr__;
}

Assistant:

SizeData GetSizeData(Vector2f& drag_delta_min, Vector2f& drag_delta_max) const
	{
		using namespace Style;
		SizeData data = {};

		data.original_size = box.GetSize(computed.box_sizing() == BoxSizing::BorderBox ? BoxArea::Border : BoxArea::Content);
		data.original_position_bottom_right = {GetPositionRight(), GetPositionBottom()};

		data.bottom_right.x = (computed.right().type != Right::Auto);
		data.bottom_right.y = (computed.bottom().type != Bottom::Auto);
		data.width_height.x = (computed.left().type == Left::Auto || computed.right().type == Right::Auto || computed.width().type != Width::Auto);
		data.width_height.y = (computed.top().type == Top::Auto || computed.bottom().type == Bottom::Auto || computed.height().type != Height::Auto);

		const Vector2f min_size = {
			ResolveValue(computed.min_width(), containing_block.x),
			ResolveValue(computed.min_height(), containing_block.y),
		};
		const Vector2f max_size = {
			ResolveValueOr(computed.max_width(), containing_block.x, FLT_MAX),
			ResolveValueOr(computed.max_height(), containing_block.y, FLT_MAX),
		};
		const Vector2f distance_to_bottom_right = DistanceToBottomRight(DistanceToTopLeft());

		drag_delta_min = Math::Max(drag_delta_min, min_size - data.original_size);
		drag_delta_max = Math::Min(drag_delta_max, max_size - data.original_size);
		drag_delta_max = Math::Min(drag_delta_max, Vector2f{-resolved_edge_margin[RIGHT], -resolved_edge_margin[BOTTOM]} + distance_to_bottom_right);

		return data;
	}